

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O2

void gba_write_word(uint32_t addr,uint32_t value,access_type_t access_type)

{
  uint16_t uVar1;
  gba_ppu_t *pgVar2;
  gbamem_t *pgVar3;
  uint8_t uVar4;
  _Bool _Var5;
  undefined1 uVar6;
  gbabus_t *pgVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  uint32_t *warr;
  gbabus_t **ppgVar11;
  gba_ppu_t **ppgVar12;
  ulong uVar13;
  int *piVar14;
  long lVar15;
  undefined8 uVar16;
  ushort uVar17;
  uint uVar19;
  int iVar20;
  char *pcVar21;
  uint32_t uVar22;
  uint uVar23;
  size_t sStack_40;
  ushort uVar18;
  
  uVar8 = (ulong)value;
  uVar10 = addr >> 0x18;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar14 = nonsequential_word_cycles;
LAB_00111a01:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar14[uVar10];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar14 = sequential_word_cycles;
    goto LAB_00111a01;
  }
  pgVar3 = mem;
  if (0xf < uVar10) {
    return;
  }
  uVar19 = addr & 0xfffffffc;
  uVar17 = (ushort)value;
  uVar18 = (ushort)(value >> 0x10);
  switch((ulong)uVar10) {
  case 0:
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar21 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_00111afd:
    printf(pcVar21);
    return;
  case 1:
    goto switchD_00111a31_caseD_1;
  case 2:
    *(uint32_t *)(mem->ewram + (addr & 0x3fffc)) = value;
    return;
  case 3:
    *(uint32_t *)(mem->iwram + (addr & 0x7ffc)) = value;
    return;
  case 4:
    break;
  case 5:
    *(uint32_t *)(ppu->pram + (addr & 0x3fc)) = value;
    return;
  case 6:
    *(uint32_t *)(ppu->vram + (ulong)(uVar19 + 0xfa000000) % 0x18000) = value;
    return;
  case 7:
    ppu->oam[addr & 0x3fc] = (uint8_t)value;
    *(uint32_t *)(ppu->oam + (addr & 0x3fc)) = value;
    return;
  case 8:
    if (uVar19 == 0x80000c8) {
      uVar22 = 0x80000c8;
LAB_00111c9d:
      gpio_write(uVar22,uVar17);
      return;
    }
    if (uVar19 == 0x80000c4) {
      gpio_write(0x80000c4,uVar17);
      uVar22 = 0x80000c6;
      uVar17 = uVar18;
      goto LAB_00111c9d;
    }
  case 0xd:
    if ((bus->backup_type == EEPROM) && ((0xdfffeff < addr || (mem->rom_size < 0x1000001)))) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5a4);
      pcVar21 = "Write word 0x%08X to EEPROM at addr 0x%08X\n\x1b[0;m";
      uVar13 = (ulong)uVar19;
      goto LAB_00113945;
    }
    if (gba_log_verbosity < 3) {
      return;
    }
    pcVar21 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
    goto LAB_00111c7e;
  default:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar21 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
      goto LAB_00111afd;
    case SRAM:
      *(uint32_t *)(mem->backup + (addr & 0x7ffc)) = value;
      pgVar3->backup_dirty = true;
      return;
    case EEPROM:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5ba);
      pcVar21 = "Backup type EEPROM unimplemented!\n\x1b[0;m";
      sStack_40 = 0x27;
      break;
    case FLASH64K:
    case FLASH128K:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5bd);
      pcVar21 = "Writing word to flash unimplemented\n\x1b[0;m";
LAB_0011388e:
      sStack_40 = 0x29;
      break;
    default:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x5c0);
      uVar8 = (ulong)bus->backup_type;
      pcVar21 = "Unknown backup type index %d!\n\x1b[0;m";
      goto LAB_001138c9;
    }
    goto LAB_00113902;
  }
  if (0x40003ff < addr) {
    return;
  }
  uVar4 = get_ioreg_size_for_addr(uVar19);
  if (uVar4 == '\x04') {
    _Var5 = is_ioreg_writable(uVar19);
    if ((!_Var5) && (gba_log_verbosity != 0)) {
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m");
    }
    pgVar2 = ppu;
    uVar10 = addr & 0xffc;
    if ((uVar10 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) {
      if ((uVar10 - 0x28 < 0x18) &&
         (uVar10 = uVar10 - 0x28 >> 2, (0x33U >> (uVar10 & 0x1f) & 1) != 0)) {
        lVar15 = *(long *)(&DAT_001230f0 + (ulong)uVar10 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint32_t *)
           ((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00123120 + (ulong)uVar10 * 8)) = value
          ;
        }
        *(uint32_t *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) = value;
        return;
      }
      goto LAB_0011394e;
    }
    if (uVar10 == 0xa4) {
      iVar20 = 1;
LAB_00111fcd:
      uVar22 = 0xffffffff;
      goto LAB_00111fcf;
    }
    if (uVar10 == 0xa0) {
      iVar20 = 0;
      goto LAB_00111fcd;
    }
    _Var5 = is_ioreg_writable(uVar19);
    if (_Var5) {
      uVar4 = get_ioreg_size_for_addr(uVar19);
      if (uVar4 == '\x04') {
        ppgVar12 = &ppu;
        if (uVar10 == 0x28) {
          sStack_40 = 0x3ecac;
          goto LAB_00112829;
        }
        if (uVar10 == 0x800) {
LAB_00112274:
          if (gba_log_verbosity == 0) {
            return;
          }
          uVar16 = 0xffffffffffffffff;
          goto LAB_0011228a;
        }
        if (uVar10 == 0x38) {
          sStack_40 = 0x3ecbc;
          goto LAB_00112829;
        }
        if (uVar10 == 0x3c) {
          sStack_40 = 0x3ecc4;
          goto LAB_00112829;
        }
        if ((uVar10 == 0xa0) || (uVar10 == 0xa4)) goto LAB_00112274;
        if (uVar10 == 0xb0) {
          sStack_40 = 0x10;
LAB_00112821:
          ppgVar12 = (gba_ppu_t **)&bus;
LAB_00112829:
          *(uint32_t *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) = value;
          return;
        }
        if (uVar10 == 0xb4) {
          sStack_40 = 0x14;
          goto LAB_00112821;
        }
        if (uVar10 == 0xbc) {
          sStack_40 = 0x30;
          goto LAB_00112821;
        }
        if (uVar10 == 0xc0) {
          sStack_40 = 0x34;
          goto LAB_00112821;
        }
        if (uVar10 == 200) {
          sStack_40 = 0x50;
          goto LAB_00112821;
        }
        if (uVar10 == 0xcc) {
          sStack_40 = 0x54;
          goto LAB_00112821;
        }
        if (uVar10 == 0xd4) {
          sStack_40 = 0x70;
          goto LAB_00112821;
        }
        if (uVar10 == 0xd8) {
          sStack_40 = 0x74;
          goto LAB_00112821;
        }
        if ((uVar10 == 0x150) || (uVar10 == 0x154)) goto LAB_00112274;
        if (uVar10 == 0x2c) {
          sStack_40 = 0x3ecb4;
          goto LAB_00112829;
        }
        goto LAB_00113b32;
      }
      goto LAB_00113a86;
    }
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
    goto LAB_00111c7e;
  }
  if (uVar4 != '\x02') {
    if (uVar4 != '\x01') {
      return;
    }
    _Var5 = is_ioreg_writable(uVar19);
    if (_Var5) {
      if ((addr & 0xffc) == 0x300) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m");
        }
        goto LAB_00111df3;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x141);
      uVar13 = uVar8 & 0xff;
      pcVar21 = "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m";
      uVar8 = (ulong)uVar19;
      goto LAB_00113945;
    }
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m");
    }
LAB_00111df3:
    uVar10 = uVar19 | 1;
    _Var5 = is_ioreg_writable(uVar10);
    if (!_Var5) {
      if (gba_log_verbosity == 0) goto LAB_00112a07;
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_00111e90:
      printf(pcVar21);
      goto LAB_00112a07;
    }
    uVar4 = get_ioreg_size_for_addr(uVar10);
    pgVar2 = ppu;
    if (uVar4 == '\x04') {
      uVar10 = value & 0xff00;
      uVar23 = addr & 0xffc;
      if ((uVar23 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar23 & 0x3f) & 1) != 0)) {
        if ((0x17 < uVar23 - 0x28) ||
           (uVar23 = uVar23 - 0x28 >> 2, (0x33U >> (uVar23 & 0x1f) & 1) == 0)) goto LAB_0011394e;
        lVar15 = *(long *)(&DAT_001230f0 + (ulong)uVar23 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00123120 + (ulong)uVar23 * 8))
               = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00123120 + (ulong)uVar23 * 8)) & 0xffff00ff | uVar10;
        }
        *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) =
             *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) & 0xffff00ff | uVar10;
      }
      else {
        if (uVar23 == 0xa4) {
          iVar20 = 1;
        }
        else {
          if (uVar23 != 0xa0) {
            _Var5 = is_ioreg_writable(uVar19);
            if (_Var5) {
              uVar4 = get_ioreg_size_for_addr(uVar19);
              if (uVar4 != '\x04') goto LAB_00113a86;
              ppgVar12 = &ppu;
              if (uVar23 == 0x28) {
                sStack_40 = 0x3ecac;
              }
              else {
                if (uVar23 == 0x800) {
LAB_00112842:
                  if (gba_log_verbosity != 0) {
                    printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                           ,(ulong)uVar19,0xff00);
                  }
                  goto LAB_00112a07;
                }
                if (uVar23 == 0x38) {
                  sStack_40 = 0x3ecbc;
                }
                else if (uVar23 == 0x3c) {
                  sStack_40 = 0x3ecc4;
                }
                else {
                  if ((uVar23 == 0xa0) || (uVar23 == 0xa4)) goto LAB_00112842;
                  if (uVar23 == 0xb0) {
                    sStack_40 = 0x10;
                  }
                  else if (uVar23 == 0xb4) {
                    sStack_40 = 0x14;
                  }
                  else if (uVar23 == 0xbc) {
                    sStack_40 = 0x30;
                  }
                  else if (uVar23 == 0xc0) {
                    sStack_40 = 0x34;
                  }
                  else if (uVar23 == 200) {
                    sStack_40 = 0x50;
                  }
                  else if (uVar23 == 0xcc) {
                    sStack_40 = 0x54;
                  }
                  else if (uVar23 == 0xd4) {
                    sStack_40 = 0x70;
                  }
                  else {
                    if (uVar23 != 0xd8) {
                      if ((uVar23 != 0x150) && (uVar23 != 0x154)) {
                        if (uVar23 != 0x2c) goto LAB_00113b32;
                        sStack_40 = 0x3ecb4;
                        goto LAB_0011383c;
                      }
                      goto LAB_00112842;
                    }
                    sStack_40 = 0x74;
                  }
                  ppgVar12 = (gba_ppu_t **)&bus;
                }
              }
LAB_0011383c:
              *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) =
                   *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) & 0xffff00ff |
                   uVar10;
            }
            else if (gba_log_verbosity != 0) {
              pcVar21 = 
              "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
              goto LAB_00111e90;
            }
            goto LAB_00112a07;
          }
          iVar20 = 0;
        }
        write_fifo(apu,iVar20,uVar10,0xff00);
      }
      goto LAB_00112a07;
    }
    if (uVar4 != '\x02') {
      if ((addr & 0xffc | 1) == 0x301) {
        if ((value >> 8 & 1) != 0) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                  ,0x139);
          pcVar21 = "Wrote to HALTCNT with bit 0 being 1\n\x1b[0;m";
          goto LAB_0011388e;
        }
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        goto LAB_00112a07;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x141);
      uVar19 = value >> 8;
      goto LAB_00113a44;
    }
    uVar10 = addr & 0xffc;
    if (0x82 < uVar10 >> 2) goto switchD_00111e58_caseD_a;
    uVar17 = uVar17 & 0xff00;
    ppgVar11 = (gbabus_t **)&ppu;
    switch(uVar10 >> 2) {
    case 0:
      sStack_40 = 0x3ec34;
      break;
    case 1:
      pgVar7 = (gbabus_t *)&ppu->DISPSTAT;
      uVar9 = 0xff00;
LAB_001129ac:
      ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw =
           (uVar17 ^ ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw) & uVar9 ^
           ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw;
      goto LAB_00112a07;
    case 2:
      sStack_40 = 0x3ec38;
      break;
    case 3:
      sStack_40 = 0x3ec40;
      break;
    case 4:
      sStack_40 = 0x3ec48;
      break;
    case 5:
      sStack_40 = 0x3ec50;
      break;
    case 6:
      sStack_40 = 0x3ec58;
      break;
    case 7:
      sStack_40 = 0x3ec60;
      break;
    case 8:
      sStack_40 = 0x3ec68;
      break;
    case 9:
      sStack_40 = 0x3ec70;
      break;
    default:
      goto switchD_00111e58_caseD_a;
    case 0xc:
      sStack_40 = 0x3ec78;
      break;
    case 0xd:
      sStack_40 = 0x3ec80;
      break;
    case 0x10:
      sStack_40 = 0x3ec88;
      break;
    case 0x11:
      sStack_40 = 0x3ec90;
      break;
    case 0x12:
      sStack_40 = 0x3ec98;
      break;
    case 0x13:
      sStack_40 = 0x3ec9c;
      break;
    case 0x14:
      sStack_40 = 0x3eca0;
      break;
    case 0x15:
      sStack_40 = 0x3eca8;
      break;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      if (gba_log_verbosity != 0) {
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_001122b6:
        printf(pcVar21);
LAB_001122bd:
        if (gba_log_verbosity != 0) {
          pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00111e90;
        }
      }
      goto LAB_00112a07;
    case 0x22:
      sStack_40 = 0x96;
      goto LAB_001129f3;
    case 0x2e:
      sStack_40 = 0x18;
      goto LAB_0011295a;
    case 0x31:
      sStack_40 = 0x38;
      goto LAB_0011295a;
    case 0x34:
      sStack_40 = 0x58;
      goto LAB_0011295a;
    case 0x37:
      sStack_40 = 0x78;
LAB_0011295a:
      *(ushort *)((long)&bus->interrupt_master_enable + sStack_40) =
           uVar17 | *(byte *)((long)&bus->interrupt_master_enable + sStack_40);
LAB_0011296f:
      gba_dma();
      goto LAB_00112a07;
    case 0x40:
      sStack_40 = 0xa2;
      goto LAB_001129f3;
    case 0x41:
      sStack_40 = 0xa4;
      goto LAB_001129f3;
    case 0x42:
      sStack_40 = 0xa6;
      goto LAB_001129f3;
    case 0x43:
      sStack_40 = 0xa8;
      goto LAB_001129f3;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x54:
    case 0x55:
    case 0x56:
      if (gba_log_verbosity != 0) {
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_001122b6;
      }
      goto LAB_00112a07;
    case 0x4c:
      sStack_40 = 8;
      goto LAB_001129f3;
    case 0x4d:
      sStack_40 = 0x90;
      goto LAB_001129f3;
    case 0x50:
      sStack_40 = 0x92;
      goto LAB_001129f3;
    case 0x80:
      sStack_40 = 4;
LAB_001129f3:
      ppgVar11 = &bus;
      break;
    case 0x81:
      (bus->WAITCNT).raw = uVar17 | *(byte *)&bus->WAITCNT;
LAB_001129d7:
      on_waitcnt_updated();
      goto LAB_00112a07;
    case 0x82:
      if (bus == (gbabus_t *)0x0) goto LAB_001122bd;
      uVar9 = 1;
      pgVar7 = bus;
      if (uVar10 == 0x208) goto LAB_001129ac;
      (bus->interrupt_master_enable).raw = uVar17 | *(byte *)&bus->interrupt_master_enable;
      if ((0x24 < uVar10 - 0xb8) || ((0x1001001001U >> ((ulong)(uVar10 - 0xb8) & 0x3f) & 1) == 0)) {
        if (uVar10 != 0x204) goto LAB_00112a07;
        goto LAB_001129d7;
      }
      goto LAB_0011296f;
    }
    *(ushort *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + sStack_40) =
         uVar17 | *(byte *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + sStack_40);
LAB_00112a07:
    uVar10 = uVar19 | 2;
    _Var5 = is_ioreg_writable(uVar10);
    if (!_Var5) {
      if (gba_log_verbosity == 0) goto LAB_00113040;
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
LAB_00112bbb:
      printf(pcVar21);
      goto LAB_00113040;
    }
    uVar4 = get_ioreg_size_for_addr(uVar10);
    pgVar7 = bus;
    pgVar2 = ppu;
    if (uVar4 == '\x04') {
      uVar10 = value & 0xff0000;
      uVar23 = addr & 0xffc;
      if ((uVar23 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar23 & 0x3f) & 1) != 0)) {
        if ((uVar23 - 0x28 < 0x18) &&
           (uVar19 = uVar23 - 0x28 >> 2, (0x33U >> (uVar19 & 0x1f) & 1) != 0)) {
          lVar15 = *(long *)(&DAT_001230f0 + (ulong)uVar19 * 8);
          if (ppu->y < 0xa1 || ppu->y == 0xe3) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be +
                     *(long *)(&DAT_00123120 + (ulong)uVar19 * 8)) =
                 *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00123120 + (ulong)uVar19 * 8)) & 0xff00ffff | uVar10;
          }
          *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) =
               *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) & 0xff00ffff | uVar10;
          goto LAB_00113040;
        }
LAB_0011394e:
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x298);
        pcVar21 = "Fatal error- should not have ended up here.\n\x1b[0;m";
        sStack_40 = 0x31;
LAB_00113902:
        fwrite(pcVar21,sStack_40,1,_stderr);
        goto LAB_0011390b;
      }
      if (uVar23 == 0xa4) {
        iVar20 = 1;
LAB_00112cc5:
        write_fifo(apu,iVar20,uVar10,0xff0000);
        goto LAB_00113040;
      }
      if (uVar23 == 0xa0) {
        iVar20 = 0;
        goto LAB_00112cc5;
      }
      _Var5 = is_ioreg_writable(uVar19);
      if (!_Var5) {
        if (gba_log_verbosity != 0) {
          pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
          goto LAB_00112bbb;
        }
        goto LAB_00113040;
      }
      uVar4 = get_ioreg_size_for_addr(uVar19);
      if (uVar4 != '\x04') {
LAB_00113a86:
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
                0x25f);
        fprintf(_stderr,"UNIMPLEMENTED CASE DETECTED: %s\n\x1b[0;m",
                "Trying to get the address of a wrong-sized word ioreg");
        goto LAB_0011390b;
      }
      ppgVar12 = &ppu;
      if (uVar23 == 0x28) {
        sStack_40 = 0x3ecac;
        goto LAB_0011376d;
      }
      if (uVar23 == 0x800) {
LAB_001136cb:
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m",
                 (ulong)uVar19,0xff0000);
        }
        goto LAB_00113040;
      }
      if (uVar23 == 0x38) {
        sStack_40 = 0x3ecbc;
LAB_0011376d:
        *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) =
             *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) & 0xff00ffff | uVar10;
        goto LAB_00113040;
      }
      if (uVar23 == 0x3c) {
        sStack_40 = 0x3ecc4;
        goto LAB_0011376d;
      }
      if ((uVar23 == 0xa0) || (uVar23 == 0xa4)) goto LAB_001136cb;
      if (uVar23 == 0xb0) {
        sStack_40 = 0x10;
LAB_00113765:
        ppgVar12 = (gba_ppu_t **)&bus;
        goto LAB_0011376d;
      }
      if (uVar23 == 0xb4) {
        sStack_40 = 0x14;
        goto LAB_00113765;
      }
      if (uVar23 == 0xbc) {
        sStack_40 = 0x30;
        goto LAB_00113765;
      }
      if (uVar23 == 0xc0) {
        sStack_40 = 0x34;
        goto LAB_00113765;
      }
      if (uVar23 == 200) {
        sStack_40 = 0x50;
        goto LAB_00113765;
      }
      if (uVar23 == 0xcc) {
        sStack_40 = 0x54;
        goto LAB_00113765;
      }
      if (uVar23 == 0xd4) {
        sStack_40 = 0x70;
        goto LAB_00113765;
      }
      if (uVar23 == 0xd8) {
        sStack_40 = 0x74;
        goto LAB_00113765;
      }
      if ((uVar23 == 0x150) || (uVar23 == 0x154)) goto LAB_001136cb;
      if (uVar23 == 0x2c) {
        sStack_40 = 0x3ecb4;
        goto LAB_0011376d;
      }
LAB_00113b32:
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x273);
      pcVar21 = 
      "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m";
      goto LAB_00113af5;
    }
    uVar19 = value >> 0x10;
    if (uVar4 != '\x02') {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x141);
LAB_00113a44:
      uVar13 = (ulong)uVar19 & 0xff;
      pcVar21 = "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m";
      uVar8 = (ulong)uVar10;
LAB_00113945:
      fprintf(_stderr,pcVar21,uVar8,uVar13);
      goto LAB_0011390b;
    }
    uVar18 = uVar18 & 0xff;
    uVar19 = addr & 0xffc | 2;
    uVar8 = (ulong)(uVar19 - 0x92);
    uVar6 = (undefined1)(value >> 0x10);
    if (0x34 < uVar19 - 0x92) {
LAB_00112a5b:
      if (uVar19 == 2) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
          goto LAB_00112df5;
        }
        goto LAB_00113040;
      }
      ppgVar12 = &ppu;
      if (uVar19 == 6) {
        if (ppu == (gba_ppu_t *)0x0) goto LAB_00112df5;
        *(undefined1 *)&ppu->y = uVar6;
        goto LAB_00113040;
      }
      if (uVar19 == 10) {
        lVar15 = 0x3ec3c;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x202) {
        (bus->IF).raw = (bus->IF).raw & ~uVar18;
        goto LAB_00113040;
      }
      if (uVar19 == 0x12) {
        lVar15 = 0x3ec4c;
LAB_0011303a:
        *(undefined1 *)((long)((*ppgVar12)->screen + -1) + 0x3be + lVar15) = uVar6;
        goto LAB_00113040;
      }
      if (uVar19 == 0x16) {
        lVar15 = 0x3ec54;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x1a) {
        lVar15 = 0x3ec5c;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x1e) {
        lVar15 = 0x3ec64;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x22) {
        lVar15 = 0x3ec6c;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x26) {
        lVar15 = 0x3ec74;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x32) {
        lVar15 = 0x3ec7c;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x36) {
        lVar15 = 0x3ec84;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x42) {
        lVar15 = 0x3ec8c;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x46) {
        lVar15 = 0x3ec94;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x4a) {
        lVar15 = 0x3ec9a;
        goto LAB_0011303a;
      }
      if (uVar19 == 0x52) {
        lVar15 = 0x3eca4;
        goto LAB_0011303a;
      }
      if (((uVar19 == 0x62) || (uVar19 == 0x72)) || (uVar19 == 0x82)) goto LAB_00112c9c;
      if (uVar19 == 0xd2) {
        uVar1 = (bus->DMA2CNT_H).raw;
        *(undefined1 *)&bus->DMA2CNT_H = uVar6;
        if (-1 < (short)uVar1) {
          (pgVar7->DMA2INT).previously_enabled = false;
        }
LAB_00112f62:
        gba_dma();
        goto LAB_00113040;
      }
      if (uVar19 == 0xde) {
        uVar1 = (bus->DMA3CNT_H).raw;
        *(undefined1 *)&bus->DMA3CNT_H = uVar6;
        if (-1 < (short)uVar1) {
          (pgVar7->DMA3INT).previously_enabled = false;
        }
        goto LAB_00112f62;
      }
      if (uVar19 == 0x102) {
        uVar17 = bus->TMCNT_H[0].raw;
        bus->TMCNT_H[0].raw = uVar17 & 0xff00 | uVar18;
        iVar20 = 0;
LAB_00113027:
        tmcnth_write(iVar20,uVar17);
        goto LAB_00113040;
      }
      if (uVar19 == 0x106) {
        uVar17 = bus->TMCNT_H[1].raw;
        bus->TMCNT_H[1].raw = uVar17 & 0xff00 | uVar18;
        iVar20 = 1;
        goto LAB_00113027;
      }
      if (uVar19 == 0x10a) {
        uVar17 = bus->TMCNT_H[2].raw;
        bus->TMCNT_H[2].raw = uVar17 & 0xff00 | uVar18;
        iVar20 = 2;
        goto LAB_00113027;
      }
      if (uVar19 == 0x10e) {
        uVar17 = bus->TMCNT_H[3].raw;
        bus->TMCNT_H[3].raw = uVar17 & 0xff00 | uVar18;
        iVar20 = 3;
        goto LAB_00113027;
      }
      if (((uVar19 == 0x122) || (uVar19 == 0x126)) || (uVar19 == 0x12a)) {
        if (gba_log_verbosity == 0) goto LAB_00113040;
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_00112dee;
      }
      if (uVar19 == 0x132) {
        lVar15 = 0x94;
        ppgVar12 = (gba_ppu_t **)&bus;
        goto LAB_0011303a;
      }
      if (uVar19 == 0xe) {
        lVar15 = 0x3ec44;
        goto LAB_0011303a;
      }
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x1ce);
      pcVar21 = "Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m";
      uVar8 = (ulong)uVar10;
      goto LAB_001138c9;
    }
    if ((0x1111UL >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0x28) {
        uVar1 = (bus->DMA0CNT_H).raw;
        *(undefined1 *)&bus->DMA0CNT_H = uVar6;
        if (-1 < (short)uVar1) {
          (pgVar7->DMA0INT).previously_enabled = false;
        }
      }
      else {
        if (uVar8 != 0x34) goto LAB_00112a5b;
        uVar1 = (bus->DMA1CNT_H).raw;
        *(undefined1 *)&bus->DMA1CNT_H = uVar6;
        if (-1 < (short)uVar1) {
          (pgVar7->DMA1INT).previously_enabled = false;
        }
      }
      goto LAB_00112f62;
    }
LAB_00112c9c:
    if (gba_log_verbosity != 0) {
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_00112dee:
      printf(pcVar21);
LAB_00112df5:
      if (gba_log_verbosity != 0) {
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00112bbb;
      }
    }
LAB_00113040:
    uVar10 = addr | 3;
    _Var5 = is_ioreg_writable(uVar10);
    if (!_Var5) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
      uVar8 = (ulong)uVar10;
      goto LAB_00111c80;
    }
    uVar4 = get_ioreg_size_for_addr(uVar10);
    pgVar7 = bus;
    pgVar2 = ppu;
    if (uVar4 == '\x04') {
      value = value & 0xff000000;
      uVar10 = addr & 0xffc;
      if ((0x3c < uVar10) || ((0x1100110000000000U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
        if (uVar10 == 0xa4) {
          iVar20 = 1;
        }
        else {
          if (uVar10 != 0xa0) {
            uVar19 = addr & 0x7fffffc;
            _Var5 = is_ioreg_writable(uVar19);
            if (!_Var5) {
              if (gba_log_verbosity == 0) {
                return;
              }
              pcVar21 = 
              "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
              uVar8 = (ulong)uVar19;
              goto LAB_00111c80;
            }
            uVar4 = get_ioreg_size_for_addr(uVar19);
            if (uVar4 != '\x04') goto LAB_00113a86;
            ppgVar12 = &ppu;
            if (uVar10 == 0x28) {
              sStack_40 = 0x3ecac;
              goto LAB_001137be;
            }
            if (uVar10 != 0x800) {
              if (uVar10 == 0x38) {
                sStack_40 = 0x3ecbc;
                goto LAB_001137be;
              }
              if (uVar10 == 0x3c) {
                sStack_40 = 0x3ecc4;
                goto LAB_001137be;
              }
              if ((uVar10 != 0xa0) && (uVar10 != 0xa4)) {
                if (uVar10 == 0xb0) {
                  sStack_40 = 0x10;
                }
                else if (uVar10 == 0xb4) {
                  sStack_40 = 0x14;
                }
                else if (uVar10 == 0xbc) {
                  sStack_40 = 0x30;
                }
                else if (uVar10 == 0xc0) {
                  sStack_40 = 0x34;
                }
                else if (uVar10 == 200) {
                  sStack_40 = 0x50;
                }
                else if (uVar10 == 0xcc) {
                  sStack_40 = 0x54;
                }
                else if (uVar10 == 0xd4) {
                  sStack_40 = 0x70;
                }
                else {
                  if (uVar10 != 0xd8) {
                    if ((uVar10 != 0x150) && (uVar10 != 0x154)) {
                      if (uVar10 == 0x2c) {
                        sStack_40 = 0x3ecb4;
                        goto LAB_001137be;
                      }
                      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                              ,0x273);
                      pcVar21 = 
                      "Tried to get the address of an unknown (but valid) word ioreg addr: 0x%08X\n\x1b[0;m"
                      ;
                      uVar8 = (ulong)uVar19;
                      goto LAB_001138c9;
                    }
                    goto LAB_001136f5;
                  }
                  sStack_40 = 0x74;
                }
                ppgVar12 = (gba_ppu_t **)&bus;
LAB_001137be:
                *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) =
                     *(uint *)((long)((*ppgVar12)->screen + -1) + 0x3be + sStack_40) & 0xffffff |
                     value;
                return;
              }
            }
LAB_001136f5:
            if (gba_log_verbosity == 0) {
              return;
            }
            uVar16 = 0xff000000;
LAB_0011228a:
            printf("\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m"
                   ,(ulong)uVar19,uVar16);
            return;
          }
          iVar20 = 0;
        }
        uVar22 = 0xff000000;
LAB_00111fcf:
        write_fifo(apu,iVar20,value,uVar22);
        return;
      }
      if ((uVar10 - 0x28 < 0x18) &&
         (uVar10 = uVar10 - 0x28 >> 2, (0x33U >> (uVar10 & 0x1f) & 1) != 0)) {
        lVar15 = *(long *)(&DAT_001230f0 + (ulong)uVar10 * 8);
        if (ppu->y < 0xa1 || ppu->y == 0xe3) {
          *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00123120 + (ulong)uVar10 * 8))
               = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                          *(long *)(&DAT_00123120 + (ulong)uVar10 * 8)) & 0xffffff | value;
        }
        *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) =
             *(uint *)((long)(pgVar2->screen + -1) + 0x3be + lVar15) & 0xffffff | value;
        return;
      }
      goto LAB_0011394e;
    }
    if (uVar4 != '\x02') {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c",
              0x141);
      pcVar21 = "Write to unknown (but valid) byte ioreg addr 0x%08X == 0x%02X\n\x1b[0;m";
      uVar8 = (ulong)uVar10;
      uVar13 = (ulong)(value >> 0x18);
      goto LAB_00113945;
    }
    uVar19 = uVar10 & 0x7fffffe;
    uVar10 = uVar10 & 0xffe;
    uVar8 = (ulong)(uVar10 - 0x92);
    uVar17 = (ushort)((value >> 0x18) << 8);
    if (uVar10 - 0x92 < 0x35) {
      if ((0x1111UL >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x28) {
          (bus->DMA0CNT_H).raw = uVar17 | *(byte *)&bus->DMA0CNT_H;
          if (-1 < (short)uVar17) {
            (pgVar7->DMA0INT).previously_enabled = false;
          }
          goto LAB_001135f1;
        }
        if (uVar8 == 0x34) {
          (bus->DMA1CNT_H).raw = uVar17 | *(byte *)&bus->DMA1CNT_H;
          if (-1 < (short)uVar17) {
            (pgVar7->DMA1INT).previously_enabled = false;
          }
          goto LAB_001135f1;
        }
        goto LAB_00113099;
      }
LAB_001132e3:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
      goto LAB_0011345b;
    }
LAB_00113099:
    if (uVar10 == 2) goto LAB_00113421;
    ppgVar12 = &ppu;
    if (uVar10 != 6) {
      if (uVar10 == 10) {
        lVar15 = 0x3ec3c;
LAB_001136af:
        *(ushort *)((long)((*ppgVar12)->screen + -1) + 0x3be + lVar15) =
             uVar17 | *(byte *)((long)((*ppgVar12)->screen + -1) + 0x3be + lVar15);
        return;
      }
      if (uVar10 == 0x202) {
        (bus->IF).raw = (bus->IF).raw & ~uVar17;
        return;
      }
      if (uVar10 == 0x12) {
        lVar15 = 0x3ec4c;
        goto LAB_001136af;
      }
      if (uVar10 == 0x16) {
        lVar15 = 0x3ec54;
        goto LAB_001136af;
      }
      if (uVar10 == 0x1a) {
        lVar15 = 0x3ec5c;
        goto LAB_001136af;
      }
      if (uVar10 == 0x1e) {
        lVar15 = 0x3ec64;
        goto LAB_001136af;
      }
      if (uVar10 == 0x22) {
        lVar15 = 0x3ec6c;
        goto LAB_001136af;
      }
      if (uVar10 == 0x26) {
        lVar15 = 0x3ec74;
        goto LAB_001136af;
      }
      if (uVar10 == 0x32) {
        lVar15 = 0x3ec7c;
        goto LAB_001136af;
      }
      if (uVar10 == 0x36) {
        lVar15 = 0x3ec84;
        goto LAB_001136af;
      }
      if (uVar10 == 0x42) {
        lVar15 = 0x3ec8c;
        goto LAB_001136af;
      }
      if (uVar10 == 0x46) {
        lVar15 = 0x3ec94;
        goto LAB_001136af;
      }
      if (uVar10 == 0x4a) {
        lVar15 = 0x3ec9a;
        goto LAB_001136af;
      }
      if (uVar10 == 0x52) {
        lVar15 = 0x3eca4;
        goto LAB_001136af;
      }
      if (((uVar10 == 0x62) || (uVar10 == 0x72)) || (uVar10 == 0x82)) goto LAB_001132e3;
      if (uVar10 == 0xd2) {
        (bus->DMA2CNT_H).raw = uVar17 | *(byte *)&bus->DMA2CNT_H;
        if (-1 < (short)uVar17) {
          (pgVar7->DMA2INT).previously_enabled = false;
        }
        goto LAB_001135f1;
      }
      if (uVar10 == 0xde) {
        (bus->DMA3CNT_H).raw = uVar17 | *(byte *)&bus->DMA3CNT_H;
        if (-1 < (short)uVar17) {
          (pgVar7->DMA3INT).previously_enabled = false;
        }
        goto LAB_001135f1;
      }
      if (uVar10 == 0x102) {
        uVar9 = bus->TMCNT_H[0].raw;
        bus->TMCNT_H[0].raw = uVar17 | uVar9 & 0xff;
        goto LAB_0011368e;
      }
      if (uVar10 == 0x106) {
        uVar9 = bus->TMCNT_H[1].raw;
        bus->TMCNT_H[1].raw = uVar17 | uVar9 & 0xff;
        goto LAB_001135c8;
      }
      if (uVar10 == 0x10a) {
        uVar9 = bus->TMCNT_H[2].raw;
        bus->TMCNT_H[2].raw = uVar17 | uVar9 & 0xff;
        goto LAB_00113649;
      }
      if (uVar10 == 0x10e) {
        uVar9 = bus->TMCNT_H[3].raw;
        bus->TMCNT_H[3].raw = uVar17 | uVar9 & 0xff;
        goto LAB_0011366b;
      }
      if (((uVar10 == 0x122) || (uVar10 == 0x126)) || (uVar10 == 0x12a)) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
        goto LAB_0011345b;
      }
      if (uVar10 == 0x132) {
        lVar15 = 0x94;
        ppgVar12 = (gba_ppu_t **)&bus;
        goto LAB_001136af;
      }
      if (uVar10 == 0xe) {
        lVar15 = 0x3ec44;
        goto LAB_001136af;
      }
      goto switchD_00111e58_caseD_a;
    }
    if (ppu != (gba_ppu_t *)0x0) {
      ppu->y = uVar17 | (byte)ppu->y;
      return;
    }
    goto LAB_00113462;
  }
  _Var5 = is_ioreg_writable(uVar19);
  if (!_Var5) {
    if (gba_log_verbosity != 0) {
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
LAB_00111dc9:
      printf(pcVar21,(ulong)uVar19);
    }
    goto LAB_0011247d;
  }
  uVar10 = addr & 0xffc;
  ppgVar11 = (gbabus_t **)&ppu;
  switch(uVar10 >> 2) {
  case 0:
    sStack_40 = 0x3ec34;
    break;
  case 1:
    pgVar7 = (gbabus_t *)&ppu->DISPSTAT;
    uVar9 = 0xfff8;
LAB_0011242f:
    ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw =
         (uVar17 ^ ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw) & uVar9 ^
         ((DISPSTAT_t *)&pgVar7->interrupt_master_enable)->raw;
    goto LAB_0011247d;
  case 2:
    sStack_40 = 0x3ec38;
    break;
  case 3:
    sStack_40 = 0x3ec40;
    break;
  case 4:
    sStack_40 = 0x3ec48;
    break;
  case 5:
    sStack_40 = 0x3ec50;
    break;
  case 6:
    sStack_40 = 0x3ec58;
    break;
  case 7:
    sStack_40 = 0x3ec60;
    break;
  case 8:
    sStack_40 = 0x3ec68;
    break;
  case 9:
    sStack_40 = 0x3ec70;
    break;
  default:
    goto switchD_00111e58_caseD_a;
  case 0xc:
    sStack_40 = 0x3ec78;
    break;
  case 0xd:
    sStack_40 = 0x3ec80;
    break;
  case 0x10:
    sStack_40 = 0x3ec88;
    break;
  case 0x11:
    sStack_40 = 0x3ec90;
    break;
  case 0x12:
    sStack_40 = 0x3ec98;
    break;
  case 0x13:
    sStack_40 = 0x3ec9c;
    break;
  case 0x14:
    sStack_40 = 0x3eca0;
    break;
  case 0x15:
    sStack_40 = 0x3eca8;
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
  case 0x21:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    if (gba_log_verbosity != 0) {
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_0011212f:
      printf(pcVar21,(ulong)uVar10);
LAB_00112139:
      if (gba_log_verbosity != 0) {
        pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
        goto LAB_00111dc9;
      }
    }
    goto LAB_0011247d;
  case 0x22:
    sStack_40 = 0x96;
    goto LAB_0011246f;
  case 0x2e:
    sStack_40 = 0x18;
    goto LAB_001123e2;
  case 0x31:
    sStack_40 = 0x38;
    goto LAB_001123e2;
  case 0x34:
    sStack_40 = 0x58;
    goto LAB_001123e2;
  case 0x37:
    sStack_40 = 0x78;
LAB_001123e2:
    *(ushort *)((long)&bus->interrupt_master_enable + sStack_40) = uVar17;
LAB_001123f1:
    gba_dma();
    goto LAB_0011247d;
  case 0x40:
    sStack_40 = 0xa2;
    goto LAB_0011246f;
  case 0x41:
    sStack_40 = 0xa4;
    goto LAB_0011246f;
  case 0x42:
    sStack_40 = 0xa6;
    goto LAB_0011246f;
  case 0x43:
    sStack_40 = 0xa8;
    goto LAB_0011246f;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x54:
  case 0x55:
  case 0x56:
    if (gba_log_verbosity != 0) {
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
      goto LAB_0011212f;
    }
    goto LAB_0011247d;
  case 0x4c:
    sStack_40 = 8;
    goto LAB_0011246f;
  case 0x4d:
    sStack_40 = 0x90;
    goto LAB_0011246f;
  case 0x50:
    sStack_40 = 0x92;
    goto LAB_0011246f;
  case 0x80:
    sStack_40 = 4;
LAB_0011246f:
    ppgVar11 = &bus;
    break;
  case 0x81:
    (bus->WAITCNT).raw = uVar17;
LAB_00112453:
    on_waitcnt_updated();
    goto LAB_0011247d;
  case 0x82:
    if (bus == (gbabus_t *)0x0) goto LAB_00112139;
    uVar9 = 1;
    pgVar7 = bus;
    if (uVar10 == 0x208) goto LAB_0011242f;
    (bus->interrupt_master_enable).raw = uVar17;
    if ((0x24 < uVar10 - 0xb8) || ((0x1001001001U >> ((ulong)(uVar10 - 0xb8) & 0x3f) & 1) == 0)) {
      if (uVar10 != 0x204) goto LAB_0011247d;
      goto LAB_00112453;
    }
    goto LAB_001123f1;
  }
  *(ushort *)((long)(((gba_ppu_t *)*ppgVar11)->screen + -1) + 0x3be + sStack_40) = uVar17;
LAB_0011247d:
  uVar19 = uVar19 | 2;
  _Var5 = is_ioreg_writable(uVar19);
  pgVar7 = bus;
  if (_Var5) {
    uVar10 = addr & 0xffc | 2;
    uVar8 = (ulong)(uVar10 - 0x92);
    if (uVar10 - 0x92 < 0x35) {
      if ((0x1111UL >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x28) {
          (bus->DMA0CNT_H).raw = uVar18;
          if (-1 < (int)value) {
            (pgVar7->DMA0INT).previously_enabled = false;
          }
          goto LAB_001135f1;
        }
        if (uVar8 == 0x34) {
          (bus->DMA1CNT_H).raw = uVar18;
          if (-1 < (int)value) {
            (pgVar7->DMA1INT).previously_enabled = false;
          }
          goto LAB_001135f1;
        }
        goto LAB_001124ab;
      }
LAB_00112609:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
LAB_0011345b:
      printf(pcVar21,(ulong)uVar10);
    }
    else {
LAB_001124ab:
      if (uVar10 == 2) {
LAB_00113421:
        if (gba_log_verbosity == 0) {
          return;
        }
        printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
      }
      else {
        ppgVar12 = &ppu;
        if (uVar10 != 6) {
          if (uVar10 == 10) {
            lVar15 = 0x3ec3c;
LAB_001127f0:
            *(ushort *)((long)((*ppgVar12)->screen + -1) + 0x3be + lVar15) = uVar18;
            return;
          }
          if (uVar10 == 0x202) {
            (bus->IF).raw = (bus->IF).raw & ~uVar18;
            return;
          }
          if (uVar10 == 0x12) {
            lVar15 = 0x3ec4c;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x16) {
            lVar15 = 0x3ec54;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x1a) {
            lVar15 = 0x3ec5c;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x1e) {
            lVar15 = 0x3ec64;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x22) {
            lVar15 = 0x3ec6c;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x26) {
            lVar15 = 0x3ec74;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x32) {
            lVar15 = 0x3ec7c;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x36) {
            lVar15 = 0x3ec84;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x42) {
            lVar15 = 0x3ec8c;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x46) {
            lVar15 = 0x3ec94;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x4a) {
            lVar15 = 0x3ec9a;
            goto LAB_001127f0;
          }
          if (uVar10 == 0x52) {
            lVar15 = 0x3eca4;
            goto LAB_001127f0;
          }
          if (((uVar10 == 0x62) || (uVar10 == 0x72)) || (uVar10 == 0x82)) goto LAB_00112609;
          if (uVar10 == 0xd2) {
            (bus->DMA2CNT_H).raw = uVar18;
            if (-1 < (int)value) {
              (pgVar7->DMA2INT).previously_enabled = false;
            }
LAB_001135f1:
            gba_dma();
            return;
          }
          if (uVar10 == 0xde) {
            (bus->DMA3CNT_H).raw = uVar18;
            if (-1 < (int)value) {
              (pgVar7->DMA3INT).previously_enabled = false;
            }
            goto LAB_001135f1;
          }
          if (uVar10 == 0x102) {
            uVar9 = bus->TMCNT_H[0].raw;
            bus->TMCNT_H[0].raw = uVar18;
LAB_0011368e:
            sStack_40._0_4_ = 0;
LAB_00113690:
            tmcnth_write((int)sStack_40,uVar9);
            return;
          }
          if (uVar10 == 0x106) {
            uVar9 = bus->TMCNT_H[1].raw;
            bus->TMCNT_H[1].raw = uVar18;
LAB_001135c8:
            sStack_40._0_4_ = 1;
            goto LAB_00113690;
          }
          if (uVar10 == 0x10a) {
            uVar9 = bus->TMCNT_H[2].raw;
            bus->TMCNT_H[2].raw = uVar18;
LAB_00113649:
            sStack_40._0_4_ = 2;
            goto LAB_00113690;
          }
          if (uVar10 == 0x10e) {
            uVar9 = bus->TMCNT_H[3].raw;
            bus->TMCNT_H[3].raw = uVar18;
LAB_0011366b:
            sStack_40._0_4_ = 3;
            goto LAB_00113690;
          }
          if (((uVar10 != 0x122) && (uVar10 != 0x126)) && (uVar10 != 0x12a)) {
            if (uVar10 == 0x132) {
              lVar15 = 0x94;
              ppgVar12 = (gba_ppu_t **)&bus;
            }
            else {
              if (uVar10 != 0xe) {
switchD_00111e58_caseD_a:
                fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                        "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gbabus.c"
                        ,0x1ce);
                pcVar21 = "Access to unknown (but valid) half ioreg addr 0x%08X\n\x1b[0;m";
LAB_00113af5:
                uVar8 = (ulong)uVar19;
LAB_001138c9:
                fprintf(_stderr,pcVar21,uVar8);
LAB_0011390b:
                exit(1);
              }
              lVar15 = 0x3ec44;
            }
            goto LAB_001127f0;
          }
          if (gba_log_verbosity == 0) {
            return;
          }
          pcVar21 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
          goto LAB_0011345b;
        }
        if (ppu != (gba_ppu_t *)0x0) {
          ppu->y = uVar18;
          return;
        }
      }
    }
LAB_00113462:
    if (gba_log_verbosity == 0) {
switchD_00111a31_caseD_1:
      return;
    }
    pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
  }
  else {
    if (gba_log_verbosity == 0) {
      return;
    }
    pcVar21 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable half ioreg 0x%08X\n\x1b[0;m";
  }
LAB_00111c7e:
  uVar8 = (ulong)uVar19;
LAB_00111c80:
  printf(pcVar21,uVar8);
  return;
}

Assistant:

void gba_write_word(word addr, word value, access_type_t access_type) {
    addr &= ~(sizeof(word) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(word), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            word_to_byte_array(mem->ewram, index, value);
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            word_to_byte_array(mem->iwram, index, value);
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                byte size = get_ioreg_size_for_addr(addr);
                switch (size) {
                    case 0:
                        return;
                    case sizeof(byte):
                        write_byte_ioreg(addr, value & 0xFF);
                        write_byte_ioreg(addr + 1, (value >> 8) & 0xFF);
                        write_byte_ioreg(addr + 2, (value >> 16) & 0xFF);
                        write_byte_ioreg(addr + 3, (value >> 24) & 0xFF);
                        break;
                    case sizeof(half):
                        write_half_ioreg(addr, value & 0xFFFF);
                        write_half_ioreg(addr + 2, (value >> 16) & 0xFFFF);
                        break;
                    case sizeof(word):
                        write_word_ioreg(addr, value);
                }
            }

#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr >= 0x4FFF600 && addr < 0x4FFF700) {
                    mgba_debug_write_byte(addr, value & 0xFF);
                    mgba_debug_write_byte(addr + 1, (value >> 8) & 0xFF);
                    mgba_debug_write_byte(addr + 2, (value >> 16) & 0xFF);
                    mgba_debug_write_byte(addr + 3, (value >> 24) & 0xFF);
                } else {
                    logfatal("Writing 0x%08X to 0x%08X\n", value, addr);
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word_to_byte_array(ppu->pram, index, value);
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            word_to_byte_array(ppu->vram, index, value);
            break;
        }
        case REGION_OAM: {
            word index = addr - 0x07000000;
            index %= OAM_SIZE;
            ppu->oam[index] = value;
            word_to_byte_array(ppu->oam, index, value);
            break;
        }
        case REGION_GAMEPAK0_L:
            switch (addr) {
                case 0x080000C4:
                    gpio_write(0x080000C4, value & 0xFFFF);
                    gpio_write(0x080000C6, (value >> 16) & 0xFFFF);
                    return;
                case 0x080000C8:
                    gpio_write(0x080000C8, value & 0xFFFF);
                    return;
                default:
                    break;
            }
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write word 0x%08X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    word_to_byte_array(mem->backup, addr & 0x7FFF, value);
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logfatal("Backup type EEPROM unimplemented!")
                case FLASH64K:
                case FLASH128K:
                    logfatal("Writing word to flash unimplemented")
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
        default:
            return;
    }
}